

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergingAlgorithm.cpp
# Opt level: O0

void __thiscall van_kampen::MergingAlgorithm::MergingAlgorithm(MergingAlgorithm *this)

{
  shared_ptr<van_kampen::Graph> local_20;
  MergingAlgorithm *local_10;
  MergingAlgorithm *this_local;
  
  local_10 = this;
  DiagrammGeneratingAlgorithm::DiagrammGeneratingAlgorithm(&this->super_DiagrammGeneratingAlgorithm)
  ;
  (this->super_DiagrammGeneratingAlgorithm)._vptr_DiagrammGeneratingAlgorithm =
       (_func_int **)&PTR_generate_00257cc8;
  this->limit = 0;
  this->quiet = false;
  std::shared_ptr<van_kampen::Graph>::shared_ptr
            (&local_20,&(this->super_DiagrammGeneratingAlgorithm).graph_);
  Diagramm::Diagramm(&this->result_,&local_20);
  std::shared_ptr<van_kampen::Graph>::~shared_ptr(&local_20);
  return;
}

Assistant:

MergingAlgorithm::MergingAlgorithm()
    : result_(graph_) {}